

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_trng::geometric_dist_&,_const_trng::geometric_dist_&> * __thiscall
Catch::ExprLhs<trng::geometric_dist_const&>::operator==
          (BinaryExpr<const_trng::geometric_dist_&,_const_trng::geometric_dist_&>
           *__return_storage_ptr__,ExprLhs<trng::geometric_dist_const&> *this,geometric_dist *rhs)

{
  double dVar1;
  double dVar2;
  geometric_dist *pgVar3;
  StringRef local_38;
  
  pgVar3 = *(geometric_dist **)this;
  dVar1 = (pgVar3->P).p_;
  dVar2 = (rhs->P).p_;
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = dVar1 == dVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_002ea4f8;
  __return_storage_ptr__->m_lhs = pgVar3;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }